

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

bool __thiscall llvm::yaml::Scanner::scanDocumentIndicator(Scanner *this,bool IsStart)

{
  iterator pcVar1;
  ilist_node_base<false> *piVar2;
  ilist_node_base<false> *piVar3;
  undefined7 in_register_00000031;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined1 local_38 [16];
  
  unrollIndent(this,-1);
  (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
  super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
  super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.super_SmallVectorBase.Size
       = 0;
  this->IsSimpleKeyAllowed = false;
  local_38[0] = 0;
  pcVar1 = this->Current;
  skip(this,3);
  piVar3 = (ilist_node_base<false> *)
           BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                     (&(this->TokenQueue).
                       super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>,0x48,0x10);
  piVar3->Prev = (ilist_node_base<false> *)0x0;
  piVar3->Next = (ilist_node_base<false> *)0x0;
  uStack_58 = SUB84(pcVar1,0);
  uStack_54 = (undefined4)((ulong)pcVar1 >> 0x20);
  *(int *)&piVar3[1].Prev = 6 - (int)CONCAT71(in_register_00000031,IsStart);
  *(undefined4 *)((long)&piVar3[1].Prev + 4) = uStack_5c;
  *(undefined4 *)&piVar3[1].Next = uStack_58;
  *(undefined4 *)((long)&piVar3[1].Next + 4) = uStack_54;
  piVar3[2].Prev = (ilist_node_base<false> *)0x3;
  piVar3[2].Next = (ilist_node_base<false> *)&piVar3[3].Next;
  std::__cxx11::string::_M_construct<char*>((string *)&piVar3[2].Next,local_38,local_38);
  piVar2 = (this->TokenQueue).List.Sentinel.
           super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
           .super_node_base_type.Prev;
  piVar3->Next = (ilist_node_base<false> *)&(this->TokenQueue).List;
  piVar3->Prev = piVar2;
  piVar2->Next = piVar3;
  (this->TokenQueue).List.Sentinel.
  super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
  .super_node_base_type.Prev = piVar3;
  return true;
}

Assistant:

bool Scanner::scanDocumentIndicator(bool IsStart) {
  unrollIndent(-1);
  SimpleKeys.clear();
  IsSimpleKeyAllowed = false;

  Token T;
  T.Kind = IsStart ? Token::TK_DocumentStart : Token::TK_DocumentEnd;
  T.Range = StringRef(Current, 3);
  skip(3);
  TokenQueue.push_back(T);
  return true;
}